

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O2

char * leveldb::GetVarint32PtrFallback(char *p,char *limit,uint32_t *value)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar4 = (byte *)0x0;
  uVar5 = 0;
  uVar3 = 0;
  while( true ) {
    if ((0x1c < uVar3) || (limit <= p)) goto LAB_00a5801e;
    bVar1 = *p;
    if (-1 < (char)bVar1) break;
    p = (char *)((byte *)p + 1);
    uVar5 = uVar5 | (bVar1 & 0x7f) << ((byte)uVar3 & 0x1f);
    uVar3 = uVar3 + 7;
  }
  *value = (uint)bVar1 << ((byte)uVar3 & 0x1f) | uVar5;
  pbVar4 = (byte *)p + 1;
LAB_00a5801e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (char *)pbVar4;
  }
  __stack_chk_fail();
}

Assistant:

const char* GetVarint32PtrFallback(const char* p, const char* limit,
                                   uint32_t* value) {
  uint32_t result = 0;
  for (uint32_t shift = 0; shift <= 28 && p < limit; shift += 7) {
    uint32_t byte = *(reinterpret_cast<const uint8_t*>(p));
    p++;
    if (byte & 128) {
      // More bytes are present
      result |= ((byte & 127) << shift);
    } else {
      result |= (byte << shift);
      *value = result;
      return reinterpret_cast<const char*>(p);
    }
  }
  return nullptr;
}